

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_dwp.c
# Opt level: O3

void beltDWPStepI(void *buf,size_t count,void *state)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  void *dest;
  
  beltHalfBlockAddBitSizeW((word *)((long)state + 0x78),count);
  lVar1 = *(long *)((long)state + 0x98);
  if (lVar1 != 0) {
    dest = (void *)((long)state + lVar1 + 0x88);
    if (count < 0x10U - lVar1) {
      memCopy(dest,buf,count);
      *(long *)((long)state + 0x98) = *(long *)((long)state + 0x98) + count;
      return;
    }
    memCopy(dest,buf,0x10U - lVar1);
    count = (count + *(long *)((long)state + 0x98)) - 0x10;
    buf = (void *)((long)buf + (0x10 - *(long *)((long)state + 0x98)));
    *(uint *)((long)state + 0x58) = *(uint *)((long)state + 0x88) ^ *(uint *)((long)state + 0x58);
    *(uint *)((long)state + 0x5c) = *(uint *)((long)state + 0x8c) ^ *(uint *)((long)state + 0x5c);
    *(uint *)((long)state + 0x60) = *(uint *)((long)state + 0x90) ^ *(uint *)((long)state + 0x60);
    *(uint *)((long)state + 100) = *(uint *)((long)state + 0x94) ^ *(uint *)((long)state + 100);
    beltPolyMul((word *)((long)state + 0x58),(word *)((long)state + 0x58),
                (word *)((long)state + 0x48),(void *)((long)state + 0xa0));
    *(undefined8 *)((long)state + 0x98) = 0;
  }
  if (0xf < count) {
    do {
      uVar2 = *buf;
      *(ulong *)((long)state + 0x88) = uVar2;
      uVar3 = *(ulong *)((long)buf + 8);
      *(ulong *)((long)state + 0x90) = uVar3;
      *(ulong *)((long)state + 0x58) = *(ulong *)((long)state + 0x58) ^ uVar2;
      *(ulong *)((long)state + 0x60) = *(ulong *)((long)state + 0x60) ^ uVar3;
      beltPolyMul((word *)((long)state + 0x58),(word *)((long)state + 0x58),
                  (word *)((long)state + 0x48),(void *)((long)state + 0xa0));
      buf = (void *)((long)buf + 0x10);
      count = count - 0x10;
    } while (0xf < count);
  }
  if (count == 0) {
    return;
  }
  *(size_t *)((long)state + 0x98) = count;
  memCopy((void *)((long)state + 0x88),buf,count);
  return;
}

Assistant:

void beltDWPStepI(const void* buf, size_t count, void* state)
{
	belt_dwp_st* st = (belt_dwp_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltDWP_keep()));
	// критические данные не обрабатывались?
	ASSERT(count == 0 || beltHalfBlockIsZero(st->len + W_OF_B(64)));
	// обновить длину
	beltHalfBlockAddBitSizeW(st->len, count);
	// есть накопленные данные?
	if (st->filled)
	{
		if (count < 16 - st->filled)
		{
			memCopy(st->block + st->filled, buf, count);
			st->filled += count;
			return;
		}
		memCopy(st->block + st->filled, buf, 16 - st->filled);
		count -= 16 - st->filled;
		buf = (const octet*)buf + 16 - st->filled;
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevW(st->block);
#endif
		beltBlockXor2(st->t, st->block);
		beltPolyMul(st->t, st->t, st->r, st->stack);
		st->filled = 0;
	}
	// цикл по полным блокам
	while (count >= 16)
	{
		beltBlockCopy(st->block, buf);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevW(st->block);
#endif
		beltBlockXor2(st->t, st->block);
		beltPolyMul(st->t, st->t, st->r, st->stack);
		buf = (const octet*)buf + 16;
		count -= 16;
	}
	// неполный блок?
	if (count)
		memCopy(st->block, buf, st->filled = count);
}